

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<std::__cxx11::string,google::protobuf::Descriptor_const*>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,std::__cxx11::string,google::protobuf::Descriptor_const*&>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                *alloc,slot_type *slot,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               Descriptor **args_1)

{
  Descriptor **args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
  *alloc_local;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  ::emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
  ::
  construct<std::pair<std::__cxx11::string,google::protobuf::Descriptor_const*>,std::__cxx11::string,google::protobuf::Descriptor_const*&>
            (alloc,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
                    *)&slot->value,args,args_1);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }